

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall
Highs::passHessian(Highs *this,HighsInt dim,HighsInt num_nz,HighsInt format,HighsInt *start,
                  HighsInt *index,double *value)

{
  int iVar1;
  bool bVar2;
  HighsStatus HVar3;
  long lVar4;
  undefined1 local_d0 [8];
  vector<int,_std::allocator<int>_> local_c8;
  vector<int,_std::allocator<int>_> local_b0;
  vector<double,_std::allocator<double>_> local_98;
  HighsHessian local_80;
  
  if ((this->written_log_header_ == false) &&
     (*(this->options_).super_HighsOptionsStruct.log_options.output_flag == true)) {
    highsLogHeader(&(this->options_).super_HighsOptionsStruct.log_options,
                   (this->options_).super_HighsOptionsStruct.log_githash);
    this->written_log_header_ = true;
  }
  HighsHessian::HighsHessian((HighsHessian *)local_d0);
  bVar2 = qFormatOk(this,num_nz,format);
  if (bVar2) {
    iVar1 = (this->model_).lp_.num_col_;
    HVar3 = kError;
    if (iVar1 == dim) {
      local_d0._4_4_ = kTriangular;
      local_d0._0_4_ = iVar1;
      if (0 < dim) {
        lVar4 = (long)iVar1;
        std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                  ((vector<int,std::allocator<int>> *)&local_c8,start,start + lVar4);
        std::vector<int,_std::allocator<int>_>::resize(&local_c8,lVar4 + 1);
        local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar4] = num_nz;
      }
      if (0 < num_nz) {
        std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                  ((vector<int,std::allocator<int>> *)&local_b0,index,index + (uint)num_nz);
        std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
                  ((vector<double,std::allocator<double>> *)&local_98,value,value + (uint)num_nz);
      }
      local_80.format_ = local_d0._4_4_;
      local_80.dim_ = local_d0._0_4_;
      std::vector<int,_std::allocator<int>_>::vector(&local_80.start_,&local_c8);
      std::vector<int,_std::allocator<int>_>::vector(&local_80.index_,&local_b0);
      std::vector<double,_std::allocator<double>_>::vector(&local_80.value_,&local_98);
      HVar3 = passHessian(this,&local_80);
      if (local_80.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_80.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_80.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_80.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_80.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_80.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
  }
  else {
    HVar3 = kError;
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "Model has illegal Hessian matrix format\n");
  }
  if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return HVar3;
}

Assistant:

HighsStatus Highs::passHessian(const HighsInt dim, const HighsInt num_nz,
                               const HighsInt format, const HighsInt* start,
                               const HighsInt* index, const double* value) {
  this->logHeader();
  HighsHessian hessian;
  if (!qFormatOk(num_nz, format)) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Model has illegal Hessian matrix format\n");
    return HighsStatus::kError;
  }
  HighsInt num_col = model_.lp_.num_col_;
  if (dim != num_col) return HighsStatus::kError;
  hessian.dim_ = num_col;
  hessian.format_ = HessianFormat::kTriangular;
  if (dim > 0) {
    assert(start != NULL);
    hessian.start_.assign(start, start + num_col);
    hessian.start_.resize(num_col + 1);
    hessian.start_[num_col] = num_nz;
  }
  if (num_nz > 0) {
    assert(index != NULL);
    assert(value != NULL);
    hessian.index_.assign(index, index + num_nz);
    hessian.value_.assign(value, value + num_nz);
  }
  return passHessian(hessian);
}